

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context_pool.hpp
# Opt level: O0

void __thiscall
coro_io::io_context_pool::io_context_pool(io_context_pool *this,size_t pool_size,bool cpu_affinity)

{
  vector<std::shared_ptr<asio::io_context::work>,_std::allocator<std::shared_ptr<asio::io_context::work>_>_>
  *this_00;
  value_type *__x;
  byte in_DL;
  __int_type_conflict2 in_RSI;
  io_context *in_RDI;
  __single_object executor;
  work_ptr work;
  io_context_ptr io_context;
  size_t i;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  __shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff60;
  promise<void> *this_01;
  io_context *piVar1;
  io_context *this_02;
  io_context *__args;
  basic_executor_type<std::allocator<void>,_0UL> local_60 [6];
  ulong local_30;
  byte local_11;
  __int_type_conflict2 local_10;
  
  local_11 = in_DL & 1;
  this_02 = in_RDI;
  local_10 = in_RSI;
  std::
  vector<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>::
  vector((vector<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>
          *)0x1b852c);
  this_01 = (promise<void> *)&this_02[1].impl_;
  std::
  vector<std::unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>,_std::allocator<std::unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>_>_>
  ::vector((vector<std::unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>,_std::allocator<std::unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>_>_>
            *)0x1b853f);
  piVar1 = this_02 + 3;
  std::
  vector<std::shared_ptr<asio::io_context::work>,_std::allocator<std::shared_ptr<asio::io_context::work>_>_>
  ::vector((vector<std::shared_ptr<asio::io_context::work>,_std::allocator<std::shared_ptr<asio::io_context::work>_>_>
            *)0x1b8552);
  std::atomic<unsigned_long>::atomic
            ((atomic<unsigned_long> *)in_stack_ffffffffffffff60,
             CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  __args = this_02 + 5;
  std::promise<void>::promise(this_01);
  std::atomic<bool>::atomic
            ((atomic<bool> *)in_stack_ffffffffffffff60,(bool)in_stack_ffffffffffffff5f);
  std::once_flag::once_flag((once_flag *)((long)&in_RDI[6].impl_ + 4));
  *(byte *)&in_RDI[7].super_execution_context.service_registry_ = local_11 & 1;
  if (local_10 == 0) {
    local_10 = 1;
  }
  std::__atomic_base<unsigned_long>::operator+=
            (&total_thread_num_.super___atomic_base<unsigned_long>,local_10);
  for (local_30 = 0; local_30 < local_10; local_30 = local_30 + 1) {
    this_00 = (vector<std::shared_ptr<asio::io_context::work>,_std::allocator<std::shared_ptr<asio::io_context::work>_>_>
               *)operator_new(0x10);
    asio::io_context::io_context(this_02,(int)((ulong)piVar1 >> 0x20));
    std::shared_ptr<asio::io_context>::shared_ptr<asio::io_context,void>
              ((shared_ptr<asio::io_context> *)in_stack_ffffffffffffff60,
               (io_context *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    __x = (value_type *)operator_new(8);
    std::__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              (in_stack_ffffffffffffff60);
    asio::io_context::work::work
              ((work *)in_stack_ffffffffffffff60,
               (io_context *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    std::shared_ptr<asio::io_context::work>::shared_ptr<asio::io_context::work,void>
              ((shared_ptr<asio::io_context::work> *)in_stack_ffffffffffffff60,
               (work *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    std::
    vector<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>::
    push_back((vector<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>
               *)this_00,__x);
    std::__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1b8694);
    in_stack_ffffffffffffff60 =
         (__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_60
    ;
    asio::io_context::get_executor
              ((io_context *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    std::
    make_unique<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>,asio::io_context::basic_executor_type<std::allocator<void>,0ul>>
              ((basic_executor_type<std::allocator<void>,_0UL> *)__args);
    asio::io_context::basic_executor_type<std::allocator<void>,_0UL>::~basic_executor_type(local_60)
    ;
    std::
    vector<std::unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>,_std::allocator<std::unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>_>_>
    ::push_back((vector<std::unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>,_std::allocator<std::unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>_>_>
                 *)in_stack_ffffffffffffff60,
                (value_type *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    std::
    vector<std::shared_ptr<asio::io_context::work>,_std::allocator<std::shared_ptr<asio::io_context::work>_>_>
    ::push_back(this_00,(value_type *)__x);
    std::
    unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>
    ::~unique_ptr((unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>
                   *)in_stack_ffffffffffffff60);
    std::shared_ptr<asio::io_context::work>::~shared_ptr
              ((shared_ptr<asio::io_context::work> *)0x1b86ff);
    std::shared_ptr<asio::io_context>::~shared_ptr((shared_ptr<asio::io_context> *)0x1b8709);
  }
  return;
}

Assistant:

explicit io_context_pool(std::size_t pool_size, bool cpu_affinity = false)
      : next_io_context_(0), cpu_affinity_(cpu_affinity) {
    if (pool_size == 0) {
      pool_size = 1;  // set default value as 1
    }

    total_thread_num_ += pool_size;

    for (std::size_t i = 0; i < pool_size; ++i) {
      io_context_ptr io_context(new asio::io_context(1));
      work_ptr work(new asio::io_context::work(*io_context));
      io_contexts_.push_back(io_context);
      auto executor = std::make_unique<coro_io::ExecutorWrapper<>>(
          io_context->get_executor());
      executors.push_back(std::move(executor));
      work_.push_back(work);
    }
  }